

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O0

void do_crop_ext_reflect(j_decompress_ptr srcinfo,j_compress_ptr dstinfo,JDIMENSION x_crop_offset,
                        JDIMENSION y_crop_offset,jvirt_barray_ptr *src_coef_arrays,
                        jvirt_barray_ptr *dst_coef_arrays)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  JBLOCKROW input_row;
  long lVar9;
  int in_ECX;
  short *psVar10;
  int in_EDX;
  short *psVar11;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  jpeg_component_info *compptr;
  JCOEFPTR dst_ptr;
  JCOEFPTR src_ptr;
  JBLOCKROW dst_row_ptr;
  JBLOCKROW src_row_ptr;
  JBLOCKARRAY dst_buffer;
  JBLOCKARRAY src_buffer;
  int offset_y;
  int k;
  int ci;
  JDIMENSION y_crop_blocks;
  JDIMENSION x_crop_blocks;
  JDIMENSION dst_blk_y;
  JDIMENSION dst_blk_x;
  JDIMENSION src_blk_x;
  JDIMENSION comp_height;
  JDIMENSION comp_width;
  JDIMENSION MCU_rows;
  JDIMENSION MCU_cols;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  undefined2 *local_88;
  undefined2 *local_80;
  undefined2 *local_78;
  undefined2 *local_70;
  int local_58;
  int local_54;
  int local_50;
  uint local_44;
  uint local_40;
  uint local_3c;
  
  uVar1 = *(uint *)(in_RDI + 0x88);
  iVar2 = *(int *)(in_RSI + 0x138);
  uVar3 = *(uint *)(in_RDI + 0x8c);
  iVar4 = *(int *)(in_RSI + 0x13c);
  local_50 = 0;
  do {
    if (*(int *)(in_RSI + 0x4c) <= local_50) {
      return;
    }
    input_row = (JBLOCKROW)(*(long *)(in_RSI + 0x58) + (long)local_50 * 0x60);
    uVar6 = (uVar1 / (uint)(iVar2 << 3)) * *(int *)(*input_row + 4);
    iVar5 = *(int *)(*input_row + 6);
    uVar7 = in_EDX * *(int *)(*input_row + 4);
    uVar8 = in_ECX * *(int *)(*input_row + 6);
    for (local_44 = 0; local_44 < *(uint *)(*input_row + 0x10);
        local_44 = *(int *)(*input_row + 6) + local_44) {
      lVar9 = (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                        (in_RDI,*(undefined8 *)(in_R9 + (long)local_50 * 8),local_44,
                         *(undefined4 *)(*input_row + 6),1);
      if (*(uint *)(in_RDI + 0x8c) < *(uint *)(in_RSI + 0x34)) {
        if ((uVar8 <= local_44) && (local_44 < uVar8 + (uVar3 / (uint)(iVar4 << 3)) * iVar5)) {
          (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                    (in_RDI,*(undefined8 *)(in_R8 + (long)local_50 * 8),local_44 - uVar8,
                     *(undefined4 *)(*input_row + 6),0);
          goto LAB_00118b90;
        }
        for (local_58 = 0; local_58 < *(int *)(*input_row + 6); local_58 = local_58 + 1) {
          memset(*(void **)(lVar9 + (long)local_58 * 8),0,(ulong)*(uint *)(*input_row + 0xe) << 7);
        }
      }
      else {
        (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                  (in_RDI,*(undefined8 *)(in_R8 + (long)local_50 * 8),local_44 + uVar8,
                   *(undefined4 *)(*input_row + 6),0);
LAB_00118b90:
        for (local_58 = 0; local_58 < *(int *)(*input_row + 6); local_58 = local_58 + 1) {
          jcopy_block_row(input_row,
                          (JBLOCKROW)
                          CONCAT17(in_stack_ffffffffffffff6f,
                                   CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),0)
          ;
          if (uVar7 != 0) {
            local_78 = (undefined2 *)(*(long *)(lVar9 + (long)local_58 * 8) + (ulong)uVar7 * 0x80);
            local_40 = uVar7;
            while (local_40 != 0) {
              local_70 = local_78;
              for (local_3c = uVar6; in_stack_ffffffffffffff6f = local_3c != 0 && local_40 != 0,
                  local_3c != 0 && local_40 != 0; local_3c = local_3c - 1) {
                local_78 = local_78 + -0x40;
                local_80 = local_70;
                local_88 = local_78;
                for (local_54 = 0; local_54 < 0x40; local_54 = local_54 + 2) {
                  psVar10 = local_80 + 1;
                  psVar11 = local_88 + 1;
                  *local_88 = *local_80;
                  local_80 = local_80 + 2;
                  local_88 = local_88 + 2;
                  *psVar11 = -*psVar10;
                }
                local_40 = local_40 - 1;
                local_70 = local_70 + 0x40;
              }
            }
          }
          if (uVar7 + uVar6 < *(uint *)(*input_row + 0xe)) {
            local_78 = (undefined2 *)
                       (*(long *)(lVar9 + (long)local_58 * 8) + (ulong)uVar7 * 0x80 +
                       (ulong)uVar6 * 0x80);
            local_40 = (*(int *)(*input_row + 0xe) - uVar7) - uVar6;
            while (local_40 != 0) {
              local_70 = local_78;
              for (local_3c = uVar6; in_stack_ffffffffffffff6e = local_3c != 0 && local_40 != 0,
                  local_3c != 0 && local_40 != 0; local_3c = local_3c - 1) {
                local_88 = local_78;
                local_70 = local_70 + -0x40;
                local_80 = local_70;
                for (local_54 = 0; local_54 < 0x40; local_54 = local_54 + 2) {
                  psVar10 = local_80 + 1;
                  psVar11 = local_88 + 1;
                  *local_88 = *local_80;
                  local_80 = local_80 + 2;
                  local_88 = local_88 + 2;
                  *psVar11 = -*psVar10;
                }
                local_40 = local_40 + -1;
                local_78 = local_78 + 0x40;
              }
            }
          }
        }
      }
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

LOCAL(void)
do_crop_ext_reflect(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
                    JDIMENSION x_crop_offset, JDIMENSION y_crop_offset,
                    jvirt_barray_ptr *src_coef_arrays,
                    jvirt_barray_ptr *dst_coef_arrays)
/* Crop.  This is only used when no rotate/flip is requested with the crop.
 * Extension: The destination width is larger than the source, and we fill in
 * the expanded region with repeated reflections of the source image.  Note
 * that we also have to fill partial iMCUs at the right and bottom edge of the
 * source image area in this case.
 */
{
  JDIMENSION MCU_cols, MCU_rows, comp_width, comp_height, src_blk_x;
  JDIMENSION dst_blk_x, dst_blk_y, x_crop_blocks, y_crop_blocks;
  int ci, k, offset_y;
  JBLOCKARRAY src_buffer, dst_buffer;
  JBLOCKROW src_row_ptr, dst_row_ptr;
  JCOEFPTR src_ptr, dst_ptr;
  jpeg_component_info *compptr;

  MCU_cols = srcinfo->output_width /
             (dstinfo->max_h_samp_factor * dstinfo_min_DCT_h_scaled_size);
  MCU_rows = srcinfo->output_height /
             (dstinfo->max_v_samp_factor * dstinfo_min_DCT_v_scaled_size);

  for (ci = 0; ci < dstinfo->num_components; ci++) {
    compptr = dstinfo->comp_info + ci;
    comp_width = MCU_cols * compptr->h_samp_factor;
    comp_height = MCU_rows * compptr->v_samp_factor;
    x_crop_blocks = x_crop_offset * compptr->h_samp_factor;
    y_crop_blocks = y_crop_offset * compptr->v_samp_factor;
    for (dst_blk_y = 0; dst_blk_y < compptr->height_in_blocks;
         dst_blk_y += compptr->v_samp_factor) {
      dst_buffer = (*srcinfo->mem->access_virt_barray)
        ((j_common_ptr)srcinfo, dst_coef_arrays[ci], dst_blk_y,
         (JDIMENSION)compptr->v_samp_factor, TRUE);
      if (dstinfo->_jpeg_height > srcinfo->output_height) {
        if (dst_blk_y < y_crop_blocks ||
            dst_blk_y >= y_crop_blocks + comp_height) {
          for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
            MEMZERO(dst_buffer[offset_y],
                    compptr->width_in_blocks * sizeof(JBLOCK));
          }
          continue;
        }
        src_buffer = (*srcinfo->mem->access_virt_barray)
          ((j_common_ptr)srcinfo, src_coef_arrays[ci],
           dst_blk_y - y_crop_blocks, (JDIMENSION)compptr->v_samp_factor,
           FALSE);
      } else {
        src_buffer = (*srcinfo->mem->access_virt_barray)
          ((j_common_ptr)srcinfo, src_coef_arrays[ci],
           dst_blk_y + y_crop_blocks, (JDIMENSION)compptr->v_samp_factor,
           FALSE);
      }
      for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
        /* Copy source region */
        jcopy_block_row(src_buffer[offset_y],
                        dst_buffer[offset_y] + x_crop_blocks, comp_width);
        if (x_crop_blocks > 0) {
          /* Reflect to left */
          dst_row_ptr = dst_buffer[offset_y] + x_crop_blocks;
          for (dst_blk_x = x_crop_blocks; dst_blk_x > 0;) {
            src_row_ptr = dst_row_ptr;      /* (re)set axis of reflection */
            for (src_blk_x = comp_width; src_blk_x > 0 && dst_blk_x > 0;
                 src_blk_x--, dst_blk_x--) {
              dst_ptr = *(--dst_row_ptr);   /* destination goes left */
              src_ptr = *src_row_ptr++;     /* source goes right */
              /* This unrolled loop doesn't need to know which row it's on. */
              for (k = 0; k < DCTSIZE2; k += 2) {
                *dst_ptr++ = *src_ptr++;    /* copy even column */
                *dst_ptr++ = -(*src_ptr++); /* copy odd column with sign
                                               change */
              }
            }
          }
        }
        if (compptr->width_in_blocks > x_crop_blocks + comp_width) {
          /* Reflect to right */
          dst_row_ptr = dst_buffer[offset_y] + x_crop_blocks + comp_width;
          for (dst_blk_x = compptr->width_in_blocks - x_crop_blocks - comp_width;
               dst_blk_x > 0;) {
            src_row_ptr = dst_row_ptr;      /* (re)set axis of reflection */
            for (src_blk_x = comp_width; src_blk_x > 0 && dst_blk_x > 0;
                 src_blk_x--, dst_blk_x--) {
              dst_ptr = *dst_row_ptr++;     /* destination goes right */
              src_ptr = *(--src_row_ptr);   /* source goes left */
              /* This unrolled loop doesn't need to know which row it's on. */
              for (k = 0; k < DCTSIZE2; k += 2) {
                *dst_ptr++ = *src_ptr++;    /* copy even column */
                *dst_ptr++ = -(*src_ptr++); /* copy odd column with sign
                                               change */
              }
            }
          }
        }
      }
    }
  }
}